

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O0

DenseSupportVectors * __thiscall
CoreML::Specification::SupportVectorClassifier::mutable_densesupportvectors
          (SupportVectorClassifier *this)

{
  bool bVar1;
  DenseSupportVectors *this_00;
  SupportVectorClassifier *this_local;
  
  bVar1 = has_densesupportvectors(this);
  if (!bVar1) {
    clear_supportVectors(this);
    set_has_densesupportvectors(this);
    this_00 = (DenseSupportVectors *)operator_new(0x30);
    DenseSupportVectors::DenseSupportVectors(this_00);
    (this->supportVectors_).densesupportvectors_ = this_00;
  }
  return (DenseSupportVectors *)(this->supportVectors_).sparsesupportvectors_;
}

Assistant:

inline ::CoreML::Specification::DenseSupportVectors* SupportVectorClassifier::mutable_densesupportvectors() {
  if (!has_densesupportvectors()) {
    clear_supportVectors();
    set_has_densesupportvectors();
    supportVectors_.densesupportvectors_ = new ::CoreML::Specification::DenseSupportVectors;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.SupportVectorClassifier.denseSupportVectors)
  return supportVectors_.densesupportvectors_;
}